

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferDetail.hh
# Opt level: O1

void __thiscall
avro::detail::Chunk::Chunk(Chunk *this,data_type *data,size_type size,free_func *func)

{
  vtable_base *pvVar1;
  undefined8 uVar2;
  CallOnDestroy *p;
  function_buffer *pfVar3;
  
  p = (CallOnDestroy *)operator_new(0x20);
  (p->func_).super_function0<void>.super_function_base.vtable = (vtable_base *)0x0;
  pvVar1 = (func->super_function0<void>).super_function_base.vtable;
  if (pvVar1 != (vtable_base *)0x0) {
    (p->func_).super_function0<void>.super_function_base.vtable = pvVar1;
    pfVar3 = &(func->super_function0<void>).super_function_base.functor;
    if (((ulong)pvVar1 & 1) == 0) {
      (*pvVar1->manager)(pfVar3,&(p->func_).super_function0<void>.super_function_base.functor,
                         clone_functor_tag);
    }
    else {
      *(undefined8 *)((long)&(p->func_).super_function0<void>.super_function_base.functor + 0x10) =
           *(undefined8 *)((long)&(func->super_function0<void>).super_function_base.functor + 0x10);
      uVar2 = *(undefined8 *)((long)&(func->super_function0<void>).super_function_base.functor + 8);
      *(undefined8 *)&(p->func_).super_function0<void>.super_function_base.functor =
           *(undefined8 *)pfVar3;
      *(undefined8 *)((long)&(p->func_).super_function0<void>.super_function_base.functor + 8) =
           uVar2;
    }
  }
  boost::shared_ptr<avro::detail::CallOnDestroy>::shared_ptr<avro::detail::CallOnDestroy>
            (&this->callOnDestroy_,p);
  (this->underlyingBlock_).px = (char *)0x0;
  (this->underlyingBlock_).pn.pi_ = (sp_counted_base *)0x0;
  this->readPos_ = data;
  this->writePos_ = data + size;
  this->endPos_ = data + size;
  return;
}

Assistant:

Chunk(const data_type *data, size_type size, const free_func &func) :
        callOnDestroy_(new CallOnDestroy(func)),
        readPos_(const_cast<data_type *>(data)),
        writePos_(readPos_ + size),
        endPos_(writePos_)
    { }